

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O1

void Nwk_ManGraphSortPairs(Nwk_Grf_t *p)

{
  int iVar1;
  uint uVar2;
  int Entry;
  Vec_Int_t *pVVar3;
  int *piVar4;
  bool bVar5;
  void *__s;
  long lVar6;
  long lVar7;
  ulong uVar8;
  
  pVVar3 = p->vPairs;
  iVar1 = pVVar3->nSize;
  uVar2 = p->nObjs;
  __s = malloc((long)(int)uVar2 * 4 + 4);
  if (-1 < (long)(int)uVar2) {
    memset(__s,0xff,(ulong)uVar2 * 4 + 4);
  }
  if (0 < iVar1) {
    piVar4 = pVVar3->pArray;
    lVar6 = 0;
    do {
      lVar7 = (long)piVar4[lVar6];
      if (*(int *)((long)__s + lVar7 * 4) != -1) {
        __assert_fail("pIdToPair[ p->vPairs->pArray[i] ] == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkMerge.c"
                      ,0x176,"void Nwk_ManGraphSortPairs(Nwk_Grf_t *)");
      }
      *(int *)((long)__s + lVar7 * 4) = piVar4[lVar6 + 1];
      lVar6 = lVar6 + 2;
    } while ((int)lVar6 < iVar1);
  }
  pVVar3->nSize = 0;
  if (-1 < p->nObjs) {
    uVar8 = 0;
    do {
      Entry = *(int *)((long)__s + uVar8 * 4);
      if (-1 < (long)Entry) {
        if ((ulong)(long)Entry <= uVar8) {
          __assert_fail("i < pIdToPair[i]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkMerge.c"
                        ,0x17e,"void Nwk_ManGraphSortPairs(Nwk_Grf_t *)");
        }
        Vec_IntPush(p->vPairs,(int)uVar8);
        Vec_IntPush(p->vPairs,Entry);
      }
      bVar5 = (long)uVar8 < (long)p->nObjs;
      uVar8 = uVar8 + 1;
    } while (bVar5);
  }
  if (iVar1 == p->vPairs->nSize) {
    if (__s != (void *)0x0) {
      free(__s);
      return;
    }
    return;
  }
  __assert_fail("nSize == Vec_IntSize(p->vPairs)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkMerge.c"
                ,0x182,"void Nwk_ManGraphSortPairs(Nwk_Grf_t *)");
}

Assistant:

void Nwk_ManGraphSortPairs( Nwk_Grf_t * p )
{
    int nSize = Vec_IntSize(p->vPairs);
    int * pIdToPair, i;
    // allocate storage
    pIdToPair = ABC_ALLOC( int, p->nObjs+1 );
    for ( i = 0; i <= p->nObjs; i++ )
        pIdToPair[i] = -1;
    // create mapping
    for ( i = 0; i < p->vPairs->nSize; i += 2 )
    {
        assert( pIdToPair[ p->vPairs->pArray[i] ] == -1 );
        pIdToPair[ p->vPairs->pArray[i] ] = p->vPairs->pArray[i+1];
    }
    // recreate pairs
    Vec_IntClear( p->vPairs );
    for ( i = 0; i <= p->nObjs; i++ )
        if ( pIdToPair[i] >= 0 )
        {
            assert( i < pIdToPair[i] );
            Vec_IntPush( p->vPairs, i );
            Vec_IntPush( p->vPairs, pIdToPair[i] );
        }
    assert( nSize == Vec_IntSize(p->vPairs) );
    ABC_FREE( pIdToPair );
}